

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

void Output::DirectPrint(char16 *string)

{
  PAL_FILE *stream;
  AutoCriticalSection local_18;
  AutoCriticalSection autocs;
  char16 *string_local;
  
  autocs.cs = (CriticalSection *)string;
  AutoCriticalSection::AutoCriticalSection(&local_18,&s_critsect);
  stream = PAL_get_stdout(0);
  PAL_fwprintf(stream,L"%s",autocs.cs);
  AutoCriticalSection::~AutoCriticalSection(&local_18);
  return;
}

Assistant:

void Output::DirectPrint(char16 const * string)
{
    AutoCriticalSection autocs(&s_critsect);

    // xplat-todo: support console color
#ifdef _WIN32
    WORD oldValue = 0;
    BOOL restoreColor = FALSE;
    HANDLE hConsole = NULL;
    if (Output::s_hasColor)
    {
        _CONSOLE_SCREEN_BUFFER_INFO info;
        hConsole = GetStdHandle(STD_OUTPUT_HANDLE);

        if (hConsole && GetConsoleScreenBufferInfo(hConsole, &info))
        {
            oldValue = info.wAttributes;
            restoreColor = SetConsoleTextAttribute(hConsole, Output::s_color);
        }
    }
#endif // _WIN32

    fwprintf(stdout, _u("%s"), string);

    // xplat-todo: support console color
#ifdef _WIN32
    if (restoreColor)
    {
        SetConsoleTextAttribute(hConsole, oldValue);
    }
#endif // _WIN32
}